

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(ON_SubDEdge *e)

{
  ON_SubDEdgeTag etag;
  uint edge_id;
  ON_SubDEdgeSharpness sharpness;
  ON_SubD_ComponentIdTypeAndTag OVar1;
  
  if (e != (ON_SubDEdge *)0x0) {
    edge_id = (e->super_ON_SubDComponentBase).m_id;
    etag = e->m_edge_tag;
    sharpness = ON_SubDEdge::Sharpness(e,false);
    OVar1 = CreateFromEdgeId(edge_id,etag,sharpness);
    return OVar1;
  }
  return (ON_SubD_ComponentIdTypeAndTag)ZEXT816((ulong)(float  [2])0x0);
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(const ON_SubDEdge * e)
{
  ON_SubD_ComponentIdTypeAndTag itt
    = (nullptr != e) 
    ? ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId(e->m_id, e->m_edge_tag, e->Sharpness(false)) 
    : ON_SubD_ComponentIdTypeAndTag::Unset;
  //if (itt.m_id > 0)
  //  itt.m_cptr = ON_SubDComponentPtr::Create(e);
  return itt;
}